

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::from_timesamples
          (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this,TimeSamples *ts)

{
  vector<int,_std::allocator<int>_> *this_00;
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar5;
  vector<int,_std::allocator<int>_> *__x;
  ulong uVar6;
  long lVar7;
  vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  buf;
  Sample s;
  
  buf.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buf.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buf.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &s.value;
  lVar7 = 0;
  uVar6 = 0;
  do {
    lVar3 = (long)(ts->_samples).
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(ts->_samples).
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar3 / 0x28;
    if (uVar4 <= uVar6) {
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ::_M_move_assign(&this->_samples,&buf,lVar3 % 0x28);
      this->_dirty = true;
LAB_0038cee3:
      ::std::
      vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ::~vector(&buf);
      return uVar4 <= uVar6;
    }
    pvVar5 = tinyusdz::value::TimeSamples::get_samples(ts);
    puVar1 = *(undefined8 **)
              ((long)&(((pvVar5->
                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                        )._M_impl.super__Vector_impl_data._M_start)->value).v_.vtable + lVar7);
    if (puVar1 == (undefined8 *)0x0) goto LAB_0038cee3;
    iVar2 = (*(code *)*puVar1)();
    if (iVar2 != 0x10000f) goto LAB_0038cee3;
    s.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_1_ = 0;
    s._25_8_ = 0;
    s.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    s.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
    _0_1_ = 0;
    s.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
    _1_7_ = 0;
    pvVar5 = tinyusdz::value::TimeSamples::get_samples(ts);
    s.t = *(double *)
           ((long)&((pvVar5->
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    )._M_impl.super__Vector_impl_data._M_start)->t + lVar7);
    pvVar5 = tinyusdz::value::TimeSamples::get_samples(ts);
    s.blocked = (&((pvVar5->
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start)->blocked)[lVar7];
    pvVar5 = tinyusdz::value::TimeSamples::get_samples(ts);
    __x = tinyusdz::value::Value::as<std::vector<int,std::allocator<int>>>
                    ((Value *)((long)&(((pvVar5->
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->value).v_.
                                      storage + lVar7),false);
    if (__x == (vector<int,_std::allocator<int>_> *)0x0) {
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&this_00->super__Vector_base<int,_std::allocator<int>_>);
      goto LAB_0038cee3;
    }
    ::std::vector<int,_std::allocator<int>_>::operator=(this_00,__x);
    ::std::
    vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
    ::push_back(&buf,&s);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&this_00->super__Vector_base<int,_std::allocator<int>_>);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x28;
  } while( true );
}

Assistant:

bool from_timesamples(const value::TimeSamples &ts) {
    std::vector<Sample> buf;
    for (size_t i = 0; i < ts.size(); i++) {
      if (ts.get_samples()[i].value.type_id() != value::TypeTraits<T>::type_id()) {
        return false;
      }
      Sample s;
      s.t = ts.get_samples()[i].t;
      s.blocked = ts.get_samples()[i].blocked;
      if (const auto pv = ts.get_samples()[i].value.as<T>()) {
        s.value = (*pv);
      } else {
        return false;
      }

      buf.push_back(s);
    }


    _samples = std::move(buf);
    _dirty = true;

    return true;
  }